

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void bitstream_put_bits(bitstream_t *bs,uint64_t value,uint num_bits)

{
  ulong uVar1;
  sbyte sVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = bs->position;
  uVar6 = (ulong)num_bits;
  pbVar3 = (bs->buffer).w + (uVar1 >> 3);
  uVar8 = (uint)uVar1 & 7;
  bs->position = uVar1 + uVar6;
  if ((uVar1 & 7) != 0) {
    uVar5 = 8 - uVar8;
    uVar7 = num_bits;
    if (uVar5 < num_bits) {
      uVar7 = uVar5;
    }
    uVar6 = (ulong)(num_bits - uVar7);
    *pbVar3 = (byte)((value >> (uVar6 & 0x3f)) << ((ulong)(uVar5 - uVar7) & 0x3f)) |
              ((byte)(0xff >> (uVar8 + uVar7 & 0x1f)) | (byte)(0xff << (uVar5 & 0x1f))) & *pbVar3;
    pbVar3 = pbVar3 + 1;
  }
  while (7 < uVar6) {
    uVar6 = uVar6 - 8;
    *pbVar3 = (byte)(value >> (uVar6 & 0x3f));
    pbVar3 = pbVar3 + 1;
  }
  if (uVar6 != 0) {
    bVar4 = (byte)uVar6;
    sVar2 = (bVar4 < 0x21) * (' ' - bVar4);
    *pbVar3 = (char)((uint)((int)value << sVar2) >> sVar2) << ((ulong)(byte)(8 - bVar4) & 0x3f) |
              (byte)(0xff >> ((uint)uVar6 & 0x1f)) & *pbVar3;
  }
  return;
}

Assistant:

static inline void bitstream_put_bits(bitstream_t* bs, uint64_t value, unsigned int num_bits) {
  ASSUME(1 <= num_bits && num_bits <= 64);

  const unsigned int skip_bits = bs->position % 8;
  uint8_t* p                   = &bs->buffer.w[bs->position / 8];

  bs->position += num_bits;
  if (skip_bits) {
    // the upper skip_bits of current pos have already been taken
    const unsigned int start_bits = 8 - skip_bits;
    const unsigned int bits       = num_bits < start_bits ? num_bits : start_bits;

    *p &= (0xFF << start_bits) | (0xFF >> (skip_bits + bits)); // clear bits before setting
    *p++ |= (value >> (num_bits - bits)) << (start_bits - bits);
    num_bits -= bits;
  }

  for (; num_bits >= 8; num_bits -= 8, ++p) {
    *p = value >> (num_bits - 8);
  }

  if (num_bits > 0) {
    *p &= (0xFF >> num_bits); // clear bits before setting
    *p |= (value & ((1 << num_bits) - 1)) << (8 - num_bits);
  }
}